

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::collapseAccessChain(Builder *this)

{
  StorageClass storageClass;
  Id IVar1;
  
  if ((this->accessChain).isRValue == false) {
    if ((this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->accessChain).indexChain.
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      IVar1 = (this->accessChain).base;
    }
    else {
      IVar1 = (this->accessChain).instr;
      if (IVar1 == 0) {
        storageClass = Module::getStorageClass
                                 (&this->module,
                                  (this->module).idToInstruction.
                                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start
                                  [(this->accessChain).base]->typeId);
        IVar1 = createAccessChain(this,storageClass,(this->accessChain).base,
                                  &(this->accessChain).indexChain);
        (this->accessChain).instr = IVar1;
      }
    }
    return IVar1;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0xa43,"Id spv::Builder::collapseAccessChain()");
}

Assistant:

Id Builder::collapseAccessChain()
{
    assert(accessChain.isRValue == false);

    if (accessChain.indexChain.size() > 0) {
        if (accessChain.instr == 0) {
            StorageClass storageClass = (StorageClass)module.getStorageClass(getTypeId(accessChain.base));
            accessChain.instr = createAccessChain(storageClass, accessChain.base, accessChain.indexChain);
        }

        return accessChain.instr;
    } else
        return accessChain.base;

    // note that non-trivial swizzling is left pending...
}